

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

logical pnga_uses_proc_grid(Integer g_a)

{
  return (ulong)(GA[g_a + 1000].distr_type == 4 || (GA[g_a + 1000].distr_type & 0xfffffffeU) == 2);
}

Assistant:

logical pnga_uses_proc_grid(Integer g_a)
{
  Integer ga_handle = GA_OFFSET + g_a;
  return (logical)(GA[ga_handle].distr_type == SCALAPACK
      || GA[ga_handle].distr_type == TILED ||
      GA[ga_handle].distr_type == TILED_IRREG);
}